

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O0

void __thiscall
ByteData160_DefaultConstructor_Test::TestBody(ByteData160_DefaultConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_260;
  Message local_258;
  ByteData local_250;
  uint8_t local_235;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_4;
  Message local_218;
  uint8_t local_20d;
  uchar local_20c [4];
  undefined1 local_208 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_1d8;
  Message local_1d0;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__1;
  Message local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158 [2];
  ByteData local_148;
  undefined1 local_130 [8];
  ByteData byte_class_data;
  Message local_110;
  ByteData local_108;
  string local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  Message local_70 [3];
  string local_58;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  ByteData160 byte_data;
  ByteData160_DefaultConstructor_Test *this_local;
  
  cfd::core::ByteData160::ByteData160((ByteData160 *)&gtest_ar.message_);
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_58,(ByteData160 *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_38,"byte_data.GetHex().c_str()",
             "\"0000000000000000000000000000000000000000\"",pcVar2,
             "0000000000000000000000000000000000000000");
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_89 = cfd::core::ByteData160::IsEmpty((ByteData160 *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_88,
               (AssertionResult *)"byte_data.IsEmpty()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  cfd::core::ByteData160::Serialize(&local_108,(ByteData160 *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_f0,&local_108);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d0,"byte_data.Serialize().GetHex().c_str()",
             "\"140000000000000000000000000000000000000000\"",pcVar2,
             "140000000000000000000000000000000000000000");
  std::__cxx11::string::~string((string *)&local_f0);
  cfd::core::ByteData::~ByteData(&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &byte_class_data.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &byte_class_data.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_110);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &byte_class_data.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  cfd::core::ByteData::ByteData((ByteData *)local_130);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData160::GetData(&local_148,(ByteData160 *)&gtest_ar.message_);
      cfd::core::ByteData::operator=((ByteData *)local_130,&local_148);
      cfd::core::ByteData::~ByteData(&local_148);
    }
  }
  else {
    testing::Message::Message(local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x16,
               "Expected: byte_class_data = byte_data.GetData() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_158);
  }
  cfd::core::ByteData160::GetBytes(&local_188,(ByteData160 *)&gtest_ar.message_);
  cfd::core::ByteData::GetBytes(&local_1a0,(ByteData *)local_130);
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_170,"byte_data.GetBytes()","byte_class_data.GetBytes()",
             &local_188,&local_1a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1c1 = cfd::core::ByteData160::Empty((ByteData160 *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_1c0,
               (AssertionResult *)"byte_data.Empty()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_20c[0] = '\0';
  local_20c[1] = '\0';
  local_20c[2] = '\0';
  local_20c[3] = '\0';
  local_20d = cfd::core::ByteData160::GetHeadData((ByteData160 *)&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<int,unsigned_char>
            (local_208,"0",(int *)"byte_data.GetHeadData()",local_20c,&local_20d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_234 = 0x14;
  cfd::core::ByteData160::Serialize(&local_250,(ByteData160 *)&gtest_ar.message_);
  local_235 = cfd::core::ByteData::GetHeadData(&local_250);
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_230,"0x14","byte_data.Serialize().GetHeadData()",&local_234,
             &local_235);
  cfd::core::ByteData::~ByteData(&local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  cfd::core::ByteData::~ByteData((ByteData *)local_130);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ByteData160, DefaultConstructor) {
  ByteData160 byte_data;

  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "0000000000000000000000000000000000000000");
  EXPECT_TRUE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "140000000000000000000000000000000000000000");
  ByteData byte_class_data;
  EXPECT_NO_THROW(byte_class_data = byte_data.GetData());
  EXPECT_EQ(byte_data.GetBytes(), byte_class_data.GetBytes());
  EXPECT_TRUE(byte_data.Empty());   // TODO(k-matsuzawa): deprecated API

  EXPECT_EQ(0, byte_data.GetHeadData());
  EXPECT_EQ(0x14, byte_data.Serialize().GetHeadData());
}